

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

uint8_t * flatbuffers::AddFlatBuffer
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,uint8_t *newbuf,
                    size_t newlen)

{
  pointer puVar1;
  difference_type __offset;
  long lVar2;
  uchar local_29;
  
  puVar1 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1;
  if (((uint)lVar2 & 7) != 4) {
    do {
      local_29 = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (flatbuf,&local_29);
      puVar1 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    } while (((uint)lVar2 & 7) != 4);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)flatbuf,puVar1 + lVar2,
             newbuf + 4,newbuf + newlen);
  return (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start +
         (ulong)*(uint *)newbuf + (ulong)((uint)lVar2 & 0xfffffffc) + -4;
}

Assistant:

const uint8_t *AddFlatBuffer(std::vector<uint8_t> &flatbuf,
                             const uint8_t *newbuf, size_t newlen) {
  // Align to sizeof(uoffset_t) past sizeof(largest_scalar_t) since we're
  // going to chop off the root offset.
  while ((flatbuf.size() & (sizeof(uoffset_t) - 1)) ||
         !(flatbuf.size() & (sizeof(largest_scalar_t) - 1))) {
    flatbuf.push_back(0);
  }
  auto insertion_point = static_cast<uoffset_t>(flatbuf.size());
  // Insert the entire FlatBuffer minus the root pointer.
  flatbuf.insert(flatbuf.end(), newbuf + sizeof(uoffset_t), newbuf + newlen);
  auto root_offset = ReadScalar<uoffset_t>(newbuf) - sizeof(uoffset_t);
  return flatbuf.data() + insertion_point + root_offset;
}